

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::LegalizeAndPruneJSInterface::run
          (LegalizeAndPruneJSInterface *this,Module *module)

{
  pointer puVar1;
  Export *pEVar2;
  size_t sVar3;
  char *pcVar4;
  FeatureSet FVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  Expression *pEVar8;
  Type *pTVar9;
  undefined1 *puVar10;
  long *plVar11;
  variant<wasm::Name,_wasm::HeapType> *__k;
  Module *pMVar12;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar13;
  long lVar14;
  Type this_00;
  Module *pMVar15;
  long *plVar16;
  undefined1 local_f0 [8];
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  exportedFunctions;
  Literal local_b0;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_98;
  size_type local_80;
  long *local_78;
  MixedArena *local_70;
  Module *local_68;
  undefined1 local_60 [8];
  Signature sig;
  Type local_48;
  Builder builder;
  Type local_38;
  
  LegalizeJSInterface::run(&this->super_LegalizeJSInterface,module);
  local_f0 = (undefined1  [8])&exportedFunctions._M_h._M_rehash_policy._M_next_resize;
  exportedFunctions._M_h._M_buckets = (__buckets_ptr)0x1;
  exportedFunctions._M_h._M_bucket_count = 0;
  exportedFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  exportedFunctions._M_h._M_element_count._0_4_ = 0x3f800000;
  exportedFunctions._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  exportedFunctions._M_h._M_rehash_policy._4_4_ = 0;
  exportedFunctions._M_h._M_rehash_policy._M_next_resize = 0;
  puVar13 = (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sig.results.id = (uintptr_t)module;
  if (puVar13 != puVar1) {
    do {
      pEVar2 = (puVar13->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar2->kind == Function) {
        if (*(__index_type *)
             ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          __k = &pEVar2->value;
        }
        else {
          __k = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        pmVar6 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_f0,(key_type *)__k);
        pcVar4 = *(char **)((long)&(pEVar2->name).super_IString + 8);
        (pmVar6->super_IString).str._M_len = *(size_t *)&(pEVar2->name).super_IString;
        (pmVar6->super_IString).str._M_str = pcVar4;
      }
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar1);
  }
  plVar11 = *(long **)(sig.results.id + 0x18);
  plVar16 = *(long **)(sig.results.id + 0x20);
  if (plVar11 != plVar16) {
    local_70 = (MixedArena *)(sig.results.id + 0x200);
    this_00.id = sig.results.id;
    local_78 = plVar16;
    do {
      sVar3 = ((key_type *)*plVar11)[2].super_IString.str._M_len;
      sVar7 = std::
              _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::count((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_f0,(key_type *)*plVar11);
      if (sVar3 != 0 || sVar7 != 0) {
        local_80 = sVar7;
        _local_60 = HeapType::getSignature((HeapType *)(*plVar11 + 0x38));
        local_48 = local_60._8_8_;
        FVar5 = wasm::Type::getFeatures(&stack0xffffffffffffffb8);
        if ((FVar5.features & 0x248) == 0) {
          local_68 = (Module *)wasm::Type::size((Type *)local_60);
          if ((long)local_68 >> 2 < 1) {
            pMVar12 = (Module *)0x0;
          }
          else {
            lVar14 = ((long)local_68 >> 2) + 1;
            pMVar12 = (Module *)0x0;
            do {
              local_48.id = (uintptr_t)local_60;
              builder.wasm = pMVar12;
              pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
              local_38.id = pTVar9->id;
              FVar5 = wasm::Type::getFeatures(&local_38);
              this_00 = sig.results;
              pMVar15 = pMVar12;
              if ((FVar5.features & 0x248) != 0) goto LAB_0091f65e;
              pMVar15 = (Module *)
                        ((long)&(pMVar12->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
              local_48.id = (uintptr_t)local_60;
              builder.wasm = pMVar15;
              pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
              local_38.id = pTVar9->id;
              FVar5 = wasm::Type::getFeatures(&local_38);
              this_00 = sig.results;
              if ((FVar5.features & 0x248) != 0) goto LAB_0091f65e;
              pMVar15 = (Module *)
                        ((long)&(pMVar12->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2);
              local_48.id = (uintptr_t)local_60;
              builder.wasm = pMVar15;
              pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
              local_38.id = pTVar9->id;
              FVar5 = wasm::Type::getFeatures(&local_38);
              this_00 = sig.results;
              if ((FVar5.features & 0x248) != 0) goto LAB_0091f65e;
              pMVar15 = (Module *)
                        ((long)&(pMVar12->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 3);
              local_48.id = (uintptr_t)local_60;
              builder.wasm = pMVar15;
              pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
              local_38.id = pTVar9->id;
              FVar5 = wasm::Type::getFeatures(&local_38);
              this_00 = sig.results;
              if ((FVar5.features & 0x248) != 0) goto LAB_0091f65e;
              pMVar12 = (Module *)
                        ((long)&(pMVar12->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4);
              lVar14 = lVar14 + -1;
            } while (1 < lVar14);
          }
          this_00.id = sig.results.id;
          lVar14 = (long)local_68 - (long)pMVar12;
          if (lVar14 == 1) {
LAB_0091f68a:
            local_48.id = (uintptr_t)local_60;
            builder.wasm = pMVar12;
            pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
            local_38.id = pTVar9->id;
            FVar5 = wasm::Type::getFeatures(&local_38);
            pMVar15 = pMVar12;
            plVar16 = local_78;
            if ((FVar5.features & 0x248) == 0) goto LAB_0091f66c;
          }
          else if (lVar14 == 2) {
LAB_0091f626:
            local_48.id = (uintptr_t)local_60;
            builder.wasm = pMVar12;
            pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
            local_38.id = pTVar9->id;
            FVar5 = wasm::Type::getFeatures(&local_38);
            pMVar15 = pMVar12;
            if ((FVar5.features & 0x248) == 0) {
              pMVar12 = (Module *)
                        ((long)&(pMVar12->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
              goto LAB_0091f68a;
            }
          }
          else {
            plVar16 = local_78;
            if (lVar14 != 3) goto LAB_0091f66c;
            local_48.id = (uintptr_t)local_60;
            builder.wasm = pMVar12;
            pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&stack0xffffffffffffffb8);
            local_38.id = pTVar9->id;
            FVar5 = wasm::Type::getFeatures(&local_38);
            pMVar15 = pMVar12;
            if ((FVar5.features & 0x248) == 0) {
              pMVar12 = (Module *)
                        ((long)&(pMVar12->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
              goto LAB_0091f626;
            }
          }
LAB_0091f65e:
          plVar16 = local_78;
          if (pMVar15 == local_68) goto LAB_0091f66c;
        }
        sVar7 = local_80;
        if (sVar3 != 0) {
          lVar14 = *plVar11;
          *(undefined8 *)(lVar14 + 0x28) = 0;
          *(undefined8 *)(lVar14 + 0x30) = 0;
          lVar14 = *plVar11;
          *(undefined8 *)(lVar14 + 0x18) = 0;
          *(undefined8 *)(lVar14 + 0x20) = 0;
          local_48.id = this_00.id;
          if (sig.params.id == 0) {
            puVar10 = (undefined1 *)MixedArena::allocSpace(local_70,0x10,8);
            *puVar10 = 0x16;
            *(undefined8 *)(puVar10 + 8) = 0;
            *(undefined1 **)(*plVar11 + 0x60) = puVar10;
          }
          else {
            Literal::makeZeros((Literals *)&exportedFunctions._M_h._M_single_bucket,sig.params);
            pEVar8 = Builder::makeConstantExpression
                               ((Builder *)&stack0xffffffffffffffb8,
                                (Literals *)&exportedFunctions._M_h._M_single_bucket);
            *(Expression **)(*plVar11 + 0x60) = pEVar8;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_98);
            Literal::~Literal(&local_b0);
          }
        }
        plVar16 = local_78;
        if (sVar7 != 0) {
          pmVar6 = std::__detail::
                   _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)local_f0,(key_type *)*plVar11);
          Module::removeExport((Module *)this_00.id,(Name)(pmVar6->super_IString).str);
          plVar16 = local_78;
        }
      }
LAB_0091f66c:
      plVar11 = plVar11 + 1;
    } while (plVar11 != plVar16);
  }
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_f0);
  return;
}

Assistant:

void run(Module* module) override {
    LegalizeJSInterface::run(module);

    prune(module);
  }